

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeFabricVertexGetDeviceExp(ze_fabric_vertex_handle_t hVertex,ze_device_handle_t *phDevice)

{
  ze_device_handle_t p_Var1;
  ze_pfnFabricVertexGetDeviceExp_t pfnGetDeviceExp;
  ze_result_t result;
  ze_device_handle_t *phDevice_local;
  ze_fabric_vertex_handle_t hVertex_local;
  
  pfnGetDeviceExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c770 == (code *)0x0) {
    p_Var1 = (ze_device_handle_t)context_t::get((context_t *)&context);
    *phDevice = p_Var1;
  }
  else {
    pfnGetDeviceExp._4_4_ = (*DAT_0011c770)(hVertex,phDevice);
  }
  return pfnGetDeviceExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeFabricVertexGetDeviceExp(
        ze_fabric_vertex_handle_t hVertex,              ///< [in] handle of the fabric vertex
        ze_device_handle_t* phDevice                    ///< [out] device handle corresponding to fabric vertex
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDeviceExp = context.zeDdiTable.FabricVertexExp.pfnGetDeviceExp;
        if( nullptr != pfnGetDeviceExp )
        {
            result = pfnGetDeviceExp( hVertex, phDevice );
        }
        else
        {
            // generic implementation
            *phDevice = reinterpret_cast<ze_device_handle_t>( context.get() );

        }

        return result;
    }